

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::Const::Const(Const *this,Generator *generator,int64_t value,uint32_t width,bool is_signed)

{
  ConstantLegal CVar1;
  UserException *pUVar2;
  undefined7 in_register_00000081;
  bool is_signed_00;
  basic_string_view<char> bVar4;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  string local_88;
  string local_68;
  ulong local_48;
  Const *local_38;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar3;
  
  aVar3.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       (CONCAT71(in_register_00000081,is_signed) & 0xffffffff);
  std::__cxx11::to_string(&local_68,value);
  is_signed_00 = aVar3._0_1_;
  Var::Var(&this->super_Var,generator,&local_68,width,1,is_signed_00,ConstValue);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002afcf0;
  this->value_ = 0;
  (this->hex_value_)._M_dataplus._M_p = (pointer)&(this->hex_value_).field_2;
  (this->hex_value_)._M_string_length = 0;
  (this->hex_value_).field_2._M_local_buf[0] = '\0';
  this->num_bits_ = 0;
  this->negative_ = false;
  CVar1 = is_legal(value,width,is_signed_00);
  local_68._M_dataplus._M_p = (pointer)value;
  local_38 = this;
  if (CVar1 == Small) {
    pUVar2 = (UserException *)__cxa_allocate_exception(0x10);
    local_68.field_2._M_allocated_capacity = -1L << ((byte)width - 1 & 0x3f);
    local_48 = (ulong)width;
    bVar4 = fmt::v7::to_string_view<char,_0>
                      ("{0} is smaller than the minimum value ({1}) given width {2}");
    format_str.data_ = (char *)bVar4.size_;
    format_str.size_ = 0x233;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar3.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar4.data_,format_str,args);
    UserException::UserException(pUVar2,&local_88);
    __cxa_throw(pUVar2,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x40 < width || CVar1 != Big) {
    this->value_ = value;
    return;
  }
  pUVar2 = (UserException *)__cxa_allocate_exception(0x10);
  local_68.field_2._M_allocated_capacity = ~(-1L << ((byte)width & 0x3f));
  local_48 = (ulong)width;
  bVar4 = fmt::v7::to_string_view<char,_0>
                    ("{0} is larger than the maximum value ({1}) given width {2}");
  format_str_00.data_ = (char *)bVar4.size_;
  format_str_00.size_ = 0x243;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = aVar3.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar4.data_,format_str_00,args_00);
  UserException::UserException(pUVar2,&local_88);
  __cxa_throw(pUVar2,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Const::Const(Generator *generator, int64_t value, uint32_t width, bool is_signed)
    : Var(generator, std::to_string(value), width, 1, is_signed, VarType::ConstValue), value_() {
    // need to deal with the signed value
    auto is_legal = Const::is_legal(value, width, is_signed);
    if (is_legal == ConstantLegal::Small) {
        uint64_t temp = (~0ull) << (width - 1);
        int64_t min = 0;
        std::memcpy(&min, &temp, sizeof(min));
        throw UserException(::format("{0} is smaller than the minimum value ({1}) given width {2}",
                                     value, min, width));
    } else if (is_legal == ConstantLegal::Big && width <= 64) {
        uint64_t max = (1ull << width) - 1;
        uint64_t unsigned_value;
        std::memcpy(&unsigned_value, &value, sizeof(unsigned_value));
        throw UserException(::format("{0} is larger than the maximum value ({1}) given width {2}",
                                     value, max, width));
    }
    value_ = value;
}